

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_set_schema(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_value *pjVar1;
  int iVar2;
  unqlite_col *pCol;
  char *pcVar3;
  int iFlag;
  SyString *pFuncName;
  jx9_vm *pVm;
  jx9_real jVar4;
  int nByte;
  SyString sName;
  uint local_2c;
  SyString local_28;
  
  if (argc < 2) {
    pVm = pCtx->pVm;
    pFuncName = &pCtx->pFunc->sName;
    pcVar3 = "Missing collection name and/or db scheme";
LAB_00119205:
    jx9VmThrowError(pVm,pFuncName,1,pcVar3);
  }
  else {
    if (((argv[1]->iFlags & 0x40) == 0) || ((*(byte *)((argv[1]->x).iVal + 0x40) & 1) == 0)) {
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar3 = "Invalid collection scheme";
      goto LAB_00119205;
    }
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_2c);
    if ((int)local_2c < 1) {
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar3 = "Invalid collection name";
      goto LAB_00119205;
    }
    local_28.nByte = local_2c;
    local_28.zString = pcVar3;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_28,iFlag);
    if (pCol == (unqlite_col *)0x0) {
      jVar4 = 0.0;
      jx9_context_throw_error_format(pCtx,2,"No such collection \'%z\'",&local_28);
      goto LAB_00119212;
    }
    pjVar1 = argv[1];
    if (((pjVar1->iFlags & 0x40) != 0) && ((*(byte *)((pjVar1->x).iVal + 0x40) & 1) != 0)) {
      iVar2 = CollectionSetHeader((unqlite_kv_engine *)0x0,pCol,-1,-1,pjVar1);
      jVar4 = (jx9_real)(ulong)(iVar2 == 0);
      goto LAB_00119212;
    }
  }
  jVar4 = 0.0;
LAB_00119212:
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  (pjVar1->x).rVal = jVar4;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_set_schema(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or db scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	if( !jx9_value_is_json_object(argv[1]) ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	rc = UNQLITE_NOOP;
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Set the collection scheme */
		rc = unqliteCollectionSetSchema(pCol,argv[1]);
	}else{
		jx9_context_throw_error_format(pCtx,JX9_CTX_WARNING,
			"No such collection '%z'",
			&sName
			);
	}
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}